

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixRandomness(sqlite3_vfs *NotUsed,int nBuf,char *zBuf)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  int got;
  int fd;
  time_t t;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int local_1c;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDX,0,(long)in_ESI);
  randomnessPid = getpid();
  uVar1 = robust_open(in_RDX,-0x55555556,0xaaaaaaaa);
  if ((int)uVar1 < 0) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    time((time_t *)&local_10);
    *(undefined1 **)in_RDX = local_10;
    *(pid_t *)(in_RDX + 8) = randomnessPid;
    local_1c = 0xc;
  }
  else {
    do {
      iVar2 = (*aSyscall[8].pCurrent)((ulong)uVar1,in_RDX,(long)in_ESI);
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        in_stack_ffffffffffffffcc = CONCAT13(*piVar3 == 4,(int3)in_stack_ffffffffffffffcc);
      }
    } while ((char)(in_stack_ffffffffffffffcc >> 0x18) != '\0');
    robust_close((unixFile *)CONCAT44(uVar1,iVar2),in_stack_ffffffffffffffcc,
                 in_stack_ffffffffffffffc8);
    local_1c = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int unixRandomness(sqlite3_vfs *NotUsed, int nBuf, char *zBuf){
  UNUSED_PARAMETER(NotUsed);
  assert((size_t)nBuf>=(sizeof(time_t)+sizeof(int)));

  /* We have to initialize zBuf to prevent valgrind from reporting
  ** errors.  The reports issued by valgrind are incorrect - we would
  ** prefer that the randomness be increased by making use of the
  ** uninitialized space in zBuf - but valgrind errors tend to worry
  ** some users.  Rather than argue, it seems easier just to initialize
  ** the whole array and silence valgrind, even if that means less randomness
  ** in the random seed.
  **
  ** When testing, initializing zBuf[] to zero is all we do.  That means
  ** that we always use the same random number sequence.  This makes the
  ** tests repeatable.
  */
  memset(zBuf, 0, nBuf);
  randomnessPid = osGetpid(0);
#if !defined(SQLITE_TEST) && !defined(SQLITE_OMIT_RANDOMNESS)
  {
    int fd, got;
    fd = robust_open("/dev/urandom", O_RDONLY, 0);
    if( fd<0 ){
      time_t t;
      time(&t);
      memcpy(zBuf, &t, sizeof(t));
      memcpy(&zBuf[sizeof(t)], &randomnessPid, sizeof(randomnessPid));
      assert( sizeof(t)+sizeof(randomnessPid)<=(size_t)nBuf );
      nBuf = sizeof(t) + sizeof(randomnessPid);
    }else{
      do{ got = osRead(fd, zBuf, nBuf); }while( got<0 && errno==EINTR );
      robust_close(0, fd, __LINE__);
    }
  }
#endif
  return nBuf;
}